

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *right)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff30;
  size_t local_b0;
  ulong local_a8;
  size_t i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_90;
  ulong local_88;
  size_t i;
  InternalStrings intern_table;
  vector<unsigned_long,_std::allocator<unsigned_long>_> right_ids;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_ids;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *right_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *left_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1f61d1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1f61da);
  anon_unknown_1::InternalStrings::InternalStrings((InternalStrings *)&i);
  local_88 = 0;
  while( true ) {
    uVar1 = local_88;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(left);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](left,local_88);
    in_stack_ffffffffffffff30 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         anon_unknown_1::InternalStrings::GetId((InternalStrings *)&i,pvVar3);
    local_90 = in_stack_ffffffffffffff30;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &right_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type_conflict1 *)&local_90);
    local_88 = local_88 + 1;
  }
  local_a8 = 0;
  while( true ) {
    uVar1 = local_a8;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(right);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](right,local_a8);
    local_b0 = anon_unknown_1::InternalStrings::GetId((InternalStrings *)&i,pvVar3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &intern_table.ids_._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_b0);
    local_a8 = local_a8 + 1;
  }
  anon_unknown_1::InternalStrings::~InternalStrings((InternalStrings *)&i);
  CalculateOptimalEdits
            (__return_storage_ptr__,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &right_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &intern_table.ids_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(
    const std::vector<std::string>& left,
    const std::vector<std::string>& right) {
  std::vector<size_t> left_ids, right_ids;
  {
    InternalStrings intern_table;
    for (size_t i = 0; i < left.size(); ++i) {
      left_ids.push_back(intern_table.GetId(left[i]));
    }
    for (size_t i = 0; i < right.size(); ++i) {
      right_ids.push_back(intern_table.GetId(right[i]));
    }
  }
  return CalculateOptimalEdits(left_ids, right_ids);
}